

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImDrawList::AddBezierCurve
          (ImDrawList *this,ImVec2 *pos0,ImVec2 *cp0,ImVec2 *cp1,ImVec2 *pos1,ImU32 col,
          float thickness,int num_segments)

{
  int *piVar1;
  int iVar2;
  ImVec2 *pIVar3;
  ImGuiContext *pIVar4;
  ImVec2 *pIVar5;
  int iVar6;
  int iVar7;
  
  pIVar4 = GImGui;
  if (col < 0x1000000) {
    return;
  }
  iVar2 = (this->_Path).Size;
  if (iVar2 == (this->_Path).Capacity) {
    if (iVar2 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar2 / 2 + iVar2;
    }
    iVar7 = iVar2 + 1;
    if (iVar2 + 1 < iVar6) {
      iVar7 = iVar6;
    }
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + 1;
    pIVar3 = (ImVec2 *)(*(pIVar4->IO).MemAllocFn)((long)iVar7 << 3);
    pIVar5 = (this->_Path).Data;
    if (pIVar5 == (ImVec2 *)0x0) {
LAB_0014ecb5:
      pIVar5 = (ImVec2 *)0x0;
      pIVar4 = GImGui;
    }
    else {
      memcpy(pIVar3,pIVar5,(long)(this->_Path).Size << 3);
      pIVar4 = GImGui;
      pIVar5 = (this->_Path).Data;
      if (pIVar5 == (ImVec2 *)0x0) goto LAB_0014ecb5;
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + -1;
    }
    (*(pIVar4->IO).MemFreeFn)(pIVar5);
    (this->_Path).Data = pIVar3;
    (this->_Path).Capacity = iVar7;
    iVar2 = (this->_Path).Size;
  }
  else {
    pIVar3 = (this->_Path).Data;
  }
  (this->_Path).Size = iVar2 + 1;
  pIVar3[iVar2] = *pos0;
  PathBezierCurveTo(this,cp0,cp1,pos1,num_segments);
  AddPolyline(this,(this->_Path).Data,(this->_Path).Size,col,false,thickness,true);
  pIVar4 = GImGui;
  if (-1 < (this->_Path).Capacity) goto LAB_0014ed84;
  piVar1 = &(GImGui->IO).MetricsAllocs;
  *piVar1 = *piVar1 + 1;
  pIVar5 = (ImVec2 *)(*(pIVar4->IO).MemAllocFn)(0);
  pIVar3 = (this->_Path).Data;
  if (pIVar3 == (ImVec2 *)0x0) {
LAB_0014ed71:
    pIVar3 = (ImVec2 *)0x0;
    pIVar4 = GImGui;
  }
  else {
    memcpy(pIVar5,pIVar3,(long)(this->_Path).Size << 3);
    pIVar4 = GImGui;
    pIVar3 = (this->_Path).Data;
    if (pIVar3 == (ImVec2 *)0x0) goto LAB_0014ed71;
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + -1;
  }
  (*(pIVar4->IO).MemFreeFn)(pIVar3);
  (this->_Path).Data = pIVar5;
  (this->_Path).Capacity = 0;
LAB_0014ed84:
  (this->_Path).Size = 0;
  return;
}

Assistant:

void ImDrawList::AddBezierCurve(const ImVec2& pos0, const ImVec2& cp0, const ImVec2& cp1, const ImVec2& pos1, ImU32 col, float thickness, int num_segments)
{
    if ((col >> 24) == 0)
        return;

    PathLineTo(pos0);
    PathBezierCurveTo(cp0, cp1, pos1, num_segments);
    PathStroke(col, false, thickness);
}